

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTasks.cpp
# Opt level: O3

Type * __thiscall
slang::ast::builtins::PrintTimeScaleTask::checkArguments
          (PrintTimeScaleTask *this,ASTContext *context,Args *args,SourceRange range,
          Expression *param_4)

{
  Compilation *pCVar1;
  bool bVar2;
  long lVar3;
  
  pCVar1 = ((context->scope).ptr)->compilation;
  bVar2 = SystemSubroutine::checkArgCount((SystemSubroutine *)this,context,false,args,range,0,1);
  if (bVar2) {
    lVar3 = 0x188;
    if (((args->_M_extent)._M_extent_value == 0) ||
       (((ulong)**(uint **)(*args->_M_ptr + 1) < 0x30 &&
        ((0x80000000000aU >> ((ulong)**(uint **)(*args->_M_ptr + 1) & 0x3f) & 1) != 0))))
    goto LAB_00404b89;
    bVar2 = Scope::isUninstantiated((context->scope).ptr);
    if (!bVar2) {
      ASTContext::addDiag(context,(DiagCode)0xb000b,(*args->_M_ptr)->sourceRange);
    }
  }
  lVar3 = 400;
LAB_00404b89:
  return *(Type **)((long)&(pCVar1->super_BumpAllocator).head + lVar3);
}

Assistant:

const Type& checkArguments(const ASTContext& context, const Args& args, SourceRange range,
                               const Expression*) const final {
        auto& comp = context.getCompilation();
        if (!checkArgCount(context, false, args, range, 0, 1))
            return comp.getErrorType();

        if (args.size() > 0) {
            auto& sym = *args[0]->as<ArbitrarySymbolExpression>().symbol;
            if (sym.kind != SymbolKind::Instance && sym.kind != SymbolKind::CompilationUnit &&
                sym.kind != SymbolKind::Root) {
                if (!context.scope->isUninstantiated())
                    context.addDiag(diag::ExpectedModuleName, args[0]->sourceRange);
                return comp.getErrorType();
            }
        }

        return comp.getVoidType();
    }